

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void upb_Map_Freeze(upb_Map *map,upb_MiniTable *m)

{
  _Bool _Var1;
  upb_MessageValue val;
  size_t iter;
  upb_MessageValue key;
  upb_MessageValue local_50;
  size_t local_40;
  upb_MessageValue local_38;
  
  if ((map->is_frozen_dont_copy_me__upb_internal_use_only == false) &&
     (map->is_frozen_dont_copy_me__upb_internal_use_only = true, m != (upb_MiniTable *)0x0)) {
    local_40 = 0xffffffffffffffff;
    while (_Var1 = upb_Map_Next(map,&local_38,&local_50,&local_40), _Var1) {
      upb_Message_Freeze(local_50.msg_val,m);
    }
  }
  return;
}

Assistant:

void upb_Map_Freeze(upb_Map* map, const upb_MiniTable* m) {
  if (upb_Map_IsFrozen(map)) return;
  UPB_PRIVATE(_upb_Map_ShallowFreeze)(map);

  if (m) {
    size_t iter = kUpb_Map_Begin;
    upb_MessageValue key, val;

    while (upb_Map_Next(map, &key, &val, &iter)) {
      upb_Message_Freeze((upb_Message*)val.msg_val, m);
    }
  }
}